

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcapi_script.cpp
# Opt level: O3

int CfdAddMultisigScriptSigData
              (void *handle,void *multisig_handle,char *signature,char *related_pubkey)

{
  pointer pcVar1;
  bool bVar2;
  size_t sVar3;
  CfdException *pCVar4;
  string sig_str;
  ByteData signature_bytes;
  allocator local_69;
  undefined1 local_68 [32];
  Pubkey local_48;
  
  cfd::Initialize();
  pcVar1 = local_68 + 0x10;
  local_68._0_8_ = pcVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_68,"MultiScriptSig","");
  cfd::capi::CheckBuffer(multisig_handle,(string *)local_68);
  if ((pointer)local_68._0_8_ != pcVar1) {
    operator_delete((void *)local_68._0_8_);
  }
  if (signature != (char *)0x0) {
    if (*(uint *)((long)multisig_handle + 0x15c8) < 0x14) {
      bVar2 = cfd::capi::IsEmptyString(signature);
      if (!bVar2) {
        local_68._0_8_ = pcVar1;
        sVar3 = strlen(signature);
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)local_68,signature,signature + sVar3);
        cfd::core::ByteData::ByteData(&local_48.data_,(string *)local_68);
        if ((pointer)local_68._0_8_ != pcVar1) {
          operator_delete((void *)local_68._0_8_);
        }
        cfd::core::ByteData::GetHex_abi_cxx11_((string *)local_68,&local_48.data_);
        std::__cxx11::string::copy
                  (local_68,(long)multisig_handle +
                            (ulong)*(uint *)((long)multisig_handle + 0x15c8) * 0x93 + 0x10,0x92);
        if ((pointer)local_68._0_8_ != pcVar1) {
          operator_delete((void *)local_68._0_8_);
        }
        if (local_48.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
            _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
          operator_delete(local_48.data_.data_.
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                          super__Vector_impl_data._M_start);
        }
      }
      bVar2 = cfd::capi::IsEmptyString(related_pubkey);
      if (!bVar2) {
        std::__cxx11::string::string((string *)local_68,related_pubkey,&local_69);
        cfd::core::Pubkey::Pubkey(&local_48,(string *)local_68);
        if ((pointer)local_68._0_8_ != pcVar1) {
          operator_delete((void *)local_68._0_8_);
        }
        cfd::core::Pubkey::GetHex_abi_cxx11_((string *)local_68,&local_48);
        std::__cxx11::string::copy
                  (local_68,(long)multisig_handle +
                            (ulong)*(uint *)((long)multisig_handle + 0x15c8) * 0x83 + 0xb8c,0x82);
        if ((pointer)local_68._0_8_ != pcVar1) {
          operator_delete((void *)local_68._0_8_);
        }
        if (local_48.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
            _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
          operator_delete(local_48.data_.data_.
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                          super__Vector_impl_data._M_start);
        }
      }
      *(int *)((long)multisig_handle + 0x15c8) = *(int *)((long)multisig_handle + 0x15c8) + 1;
      return 0;
    }
    local_68._0_8_ = "cfdcapi_script.cpp";
    local_68._8_4_ = 0x138;
    local_68._16_8_ = "CfdAddMultisigScriptSigData";
    cfd::core::logger::log<>
              ((CfdSourceLocation *)local_68,kCfdLogLevelWarning,
               "The number of signature has reached the upper limit.");
    pCVar4 = (CfdException *)__cxa_allocate_exception(0x30);
    local_68._0_8_ = pcVar1;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_68,"The number of signature has reached the upper limit.","");
    cfd::core::CfdException::CfdException(pCVar4,kCfdOutOfRangeError,(string *)local_68);
    __cxa_throw(pCVar4,&cfd::core::CfdException::typeinfo,cfd::core::CfdException::~CfdException);
  }
  local_68._0_8_ = "cfdcapi_script.cpp";
  local_68._8_4_ = 0x12e;
  local_68._16_8_ = "CfdAddMultisigScriptSigData";
  cfd::core::logger::log<>((CfdSourceLocation *)local_68,kCfdLogLevelWarning,"signature is null.");
  pCVar4 = (CfdException *)__cxa_allocate_exception(0x30);
  local_68._0_8_ = pcVar1;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_68,"Failed to parameter. signature is null.","");
  cfd::core::CfdException::CfdException(pCVar4,kCfdIllegalArgumentError,(string *)local_68);
  __cxa_throw(pCVar4,&cfd::core::CfdException::typeinfo,cfd::core::CfdException::~CfdException);
}

Assistant:

int CfdAddMultisigScriptSigData(
    void* handle, void* multisig_handle, const char* signature,
    const char* related_pubkey) {
  int result = CfdErrorCode::kCfdUnknownError;
  try {
    cfd::Initialize();
    CheckBuffer(multisig_handle, kPrefixMultisigScriptSig);
    if (signature == nullptr) {
      warn(CFD_LOG_SOURCE, "signature is null.");
      throw CfdException(
          CfdError::kCfdIllegalArgumentError,
          "Failed to parameter. signature is null.");
    }

    CfdCapiMultisigScriptSigData* data =
        static_cast<CfdCapiMultisigScriptSigData*>(multisig_handle);
    if (data->current_index >= kMultisigMaxKeyNum) {
      warn(
          CFD_LOG_SOURCE,
          "The number of signature has reached the upper limit.");
      throw CfdException(
          CfdError::kCfdOutOfRangeError,
          "The number of signature has reached the upper limit.");
    }

    if (!IsEmptyString(signature)) {
      ByteData signature_bytes = ByteData(std::string(signature));
      std::string sig_str = signature_bytes.GetHex();
      sig_str.copy(data->signatures[data->current_index], kSignatureHexSize);
    }

    if (!IsEmptyString(related_pubkey)) {
      Pubkey key = Pubkey(std::string(related_pubkey));
      std::string pubkey_str = key.GetHex();
      pubkey_str.copy(data->pubkeys[data->current_index], kPubkeyHexSize);
    }

    ++(data->current_index);
    return CfdErrorCode::kCfdSuccess;
  } catch (const CfdException& except) {
    result = SetLastError(handle, except);
  } catch (const std::exception& std_except) {
    SetLastFatalError(handle, std_except.what());
  } catch (...) {
    SetLastFatalError(handle, "unknown error.");
  }
  return result;
}